

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base.cpp
# Opt level: O0

int __thiscall xmrig::Base::init(Base *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int priority;
  Api *pAVar2;
  EVP_PKEY_CTX *ctx_00;
  Config *pCVar3;
  CpuConfig *this_00;
  ConsoleLog *this_01;
  char *pcVar4;
  Api *unaff_retaddr;
  char *in_stack_00000188;
  FileLog *in_stack_00000190;
  IApiListener *in_stack_ffffffffffffffa8;
  Api *in_stack_ffffffffffffffb0;
  SysLog *in_stack_ffffffffffffffc0;
  Base *base;
  
  base = this;
  pAVar2 = (Api *)operator_new(0xd8);
  Api::Api(unaff_retaddr,base);
  this->d_ptr->api = pAVar2;
  Api::addListener(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  config(this);
  ctx_00 = (EVP_PKEY_CTX *)BaseConfig::userAgent((BaseConfig *)0x1b3007);
  Platform::init(ctx_00);
  pCVar3 = config(this);
  this_00 = Config::cpu(pCVar3);
  priority = CpuConfig::priority(this_00);
  Platform::setProcessPriority(priority);
  bVar1 = isBackground((Base *)in_stack_ffffffffffffffb0);
  if (bVar1) {
    Log::background = 1;
  }
  else {
    this_01 = (ConsoleLog *)operator_new(0x10);
    ConsoleLog::ConsoleLog(this_01);
    Log::add((ILogBackend *)0x1b308f);
  }
  config(this);
  pcVar4 = BaseConfig::logFile((BaseConfig *)0x1b30c0);
  if (pcVar4 != (char *)0x0) {
    in_stack_ffffffffffffffc0 = (SysLog *)operator_new(0x10);
    config(this);
    BaseConfig::logFile((BaseConfig *)0x1b30f0);
    FileLog::FileLog(in_stack_00000190,in_stack_00000188);
    Log::add((ILogBackend *)0x1b3112);
  }
  pCVar3 = config(this);
  bVar1 = BaseConfig::isSyslog(&pCVar3->super_BaseConfig);
  if (bVar1) {
    operator_new(8);
    SysLog::SysLog(in_stack_ffffffffffffffc0);
    Log::add((ILogBackend *)0x1b316c);
  }
  return 0;
}

Assistant:

int xmrig::Base::init()
{
#   ifdef XMRIG_FEATURE_API
    d_ptr->api = new Api(this);
    d_ptr->api->addListener(this);
#   endif

    Platform::init(config()->userAgent());

    Platform::setProcessPriority(config()->cpu().priority());

    if (isBackground()) {
        Log::background = true;
    }
    else {
        Log::add(new ConsoleLog());
    }

    if (config()->logFile()) {
        Log::add(new FileLog(config()->logFile()));
    }

#   ifdef HAVE_SYSLOG_H
    if (config()->isSyslog()) {
        Log::add(new SysLog());
    }
#   endif

    return 0;
}